

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifest.h
# Opt level: O1

StringRef __thiscall llbuild::ninja::Scope::lookupBinding(Scope *this,StringRef name)

{
  int iVar1;
  StringRef SVar2;
  
  iVar1 = llvm::StringMapImpl::FindKey(&(this->entries).super_StringMapImpl,name);
  if ((iVar1 == -1) || ((long)iVar1 == (ulong)(this->entries).super_StringMapImpl.NumBuckets)) {
    if (this->parent == (Scope *)0x0) {
      SVar2 = (StringRef)ZEXT816(0x1d477f);
    }
    else {
      SVar2 = lookupBinding(this->parent,name);
    }
  }
  else {
    SVar2 = *(StringRef *)((this->entries).super_StringMapImpl.TheTable[iVar1] + 1);
  }
  return SVar2;
}

Assistant:

StringRef lookupBinding(StringRef name) const {
    auto it = entries.find(name);
    if (it != entries.end())
      return it->second;

    if (parent)
      return parent->lookupBinding(name);

    return "";
  }